

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_Page.cc
# Opt level: O1

void __thiscall MyDB_PageBase::writeToDisk(MyDB_PageBase *this,void *data)

{
  long lVar1;
  int __fd;
  string *psVar2;
  size_t sVar3;
  
  psVar2 = MyDB_Table::getStorageLoc_abi_cxx11_
                     ((this->pageId).first.
                      super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  __fd = open((psVar2->_M_dataplus)._M_p,0x101042,0x1b6);
  lVar1 = (this->pageId).second;
  sVar3 = MyDB_BufferManager::getPageSize(this->bufferManager);
  lseek(__fd,lVar1 * sVar3,0);
  sVar3 = MyDB_BufferManager::getPageSize(this->bufferManager);
  write(__fd,data,sVar3);
  close(__fd);
  this->isDirty = false;
  return;
}

Assistant:

void MyDB_PageBase:: writeToDisk(void* data) {
    int fd = open(pageId.first -> getStorageLoc().c_str(), O_CREAT|O_SYNC|O_RDWR, 0666);
    lseek(fd, pageId.second * bufferManager -> getPageSize(), SEEK_SET);
    //write(int filedes, const void *buf, size_t nbytes); write nbytes data from buf to filedes
    write(fd, (char*)data, bufferManager -> getPageSize());
    close(fd);
    this -> isDirty = false;
}